

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O3

void __thiscall
Js::LineOffsetCache::BuildCache
          (LineOffsetCache *this,Recycler *allocator,LPCUTF8 sourceStartCharacter,
          LPCUTF8 sourceEndCharacter,charcount_t startingCharacterOffset,
          charcount_t startingByteOffset)

{
  code *pcVar1;
  undefined8 allocator_00;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *pRVar4;
  undefined1 local_80 [8];
  TrackAllocData data;
  LPCUTF8 local_48;
  LPCUTF8 sourceStartCharacter_local;
  charcount_t local_38;
  charcount_t local_34;
  charcount_t startingCharacterOffset_local;
  charcount_t startingByteOffset_local;
  
  data._32_8_ = allocator;
  local_48 = sourceStartCharacter;
  sourceStartCharacter_local._4_4_ = startingByteOffset;
  local_38 = startingCharacterOffset;
  local_34 = startingByteOffset;
  if (sourceStartCharacter == (LPCUTF8)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,199,"(sourceStartCharacter)",
                                "The source start character passed in is null.");
    if (!bVar2) goto LAB_00781683;
    *puVar3 = 0;
  }
  if (sourceEndCharacter == (LPCUTF8)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,200,"(sourceEndCharacter)",
                                "The source end character passed in is null.");
    if (!bVar2) goto LAB_00781683;
    *puVar3 = 0;
  }
  if (sourceEndCharacter < sourceStartCharacter) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0xc9,"(sourceStartCharacter <= sourceEndCharacter)",
                                "The source start character should not be beyond the source end character."
                               );
    if (!bVar2) goto LAB_00781683;
    *puVar3 = 0;
  }
  if ((this->lineCharacterOffsetCacheList).ptr !=
      (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0xca,"(!this->lineCharacterOffsetCacheList)",
                                "The cache is already built.");
    if (!bVar2) {
LAB_00781683:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  allocator_00 = data._32_8_;
  local_80 = (undefined1  [8])
             &JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2c33433;
  data.filename._0_4_ = 0xcc;
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)data._32_8_,(TrackAllocData *)local_80);
  pRVar4 = (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)
           new<Memory::Recycler>(0x30,alloc,0x387914);
  pRVar4->alloc = (Type)allocator_00;
  pRVar4->_vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014db338;
  (pRVar4->buffer).ptr = (uint *)0x0;
  pRVar4->count = 0;
  pRVar4[1]._vptr_ReadOnlyList = (_func_int **)0x400000000;
  Memory::Recycler::WBSetBit((char *)this);
  (this->lineCharacterOffsetCacheList).ptr = pRVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  AddLine(this,(Recycler *)allocator_00,startingCharacterOffset,sourceStartCharacter_local._4_4_);
  bVar2 = FindNextLine(&local_48,sourceEndCharacter,&local_38,&local_34,0xffffffff);
  if (bVar2) {
    do {
      AddLine(this,(Recycler *)allocator_00,local_38,local_34);
      bVar2 = FindNextLine(&local_48,sourceEndCharacter,&local_38,&local_34,0xffffffff);
    } while (bVar2);
  }
  return;
}

Assistant:

void LineOffsetCache::BuildCache(Recycler * allocator, _In_z_ LPCUTF8 sourceStartCharacter,
        _In_z_ LPCUTF8 sourceEndCharacter,
        charcount_t startingCharacterOffset,
        charcount_t startingByteOffset)
    {
        AssertMsg(sourceStartCharacter, "The source start character passed in is null.");
        AssertMsg(sourceEndCharacter, "The source end character passed in is null.");
        AssertMsg(sourceStartCharacter <= sourceEndCharacter, "The source start character should not be beyond the source end character.");
        AssertMsg(!this->lineCharacterOffsetCacheList, "The cache is already built.");

        this->lineCharacterOffsetCacheList = RecyclerNew(allocator, LineOffsetCacheList, allocator);

        // Add the first line in the cache list.
        this->AddLine(allocator, startingCharacterOffset, startingByteOffset);

        while (FindNextLine(sourceStartCharacter, sourceEndCharacter, startingCharacterOffset, startingByteOffset))
        {
            this->AddLine(allocator, startingCharacterOffset, startingByteOffset);
        }

    }